

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O2

Abc_Cex_t * Abc_CexPermute(Abc_Cex_t *p,Vec_Int_t *vMapOld2New)

{
  int iVar1;
  Abc_Cex_t *pAVar2;
  int i;
  uint uVar3;
  
  if (vMapOld2New->nSize == p->nPis) {
    pAVar2 = Abc_CexAlloc(p->nRegs,vMapOld2New->nSize,p->iFrame + 1);
    iVar1 = p->iFrame;
    pAVar2->iPo = p->iPo;
    pAVar2->iFrame = iVar1;
    for (uVar3 = p->nRegs; (int)uVar3 < p->nBits; uVar3 = uVar3 + 1) {
      if (((uint)(&p[1].iPo)[(int)uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0) {
        i = (int)(uVar3 - p->nRegs) % p->nPis;
        iVar1 = Vec_IntEntry(vMapOld2New,i);
        iVar1 = (uVar3 - i) + iVar1;
        (&pAVar2[1].iPo)[iVar1 >> 5] = (&pAVar2[1].iPo)[iVar1 >> 5] | 1 << ((byte)iVar1 & 0x1f);
      }
    }
    return pAVar2;
  }
  __assert_fail("Vec_IntSize(vMapOld2New) == p->nPis",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilCex.c"
                ,0x1eb,"Abc_Cex_t *Abc_CexPermute(Abc_Cex_t *, Vec_Int_t *)");
}

Assistant:

Abc_Cex_t * Abc_CexPermute( Abc_Cex_t * p, Vec_Int_t * vMapOld2New )
{
    Abc_Cex_t * pCex;
    int i, iNew;
    assert( Vec_IntSize(vMapOld2New) == p->nPis );
    pCex = Abc_CexAlloc( p->nRegs, p->nPis, p->iFrame+1 );
    pCex->iPo    = p->iPo;
    pCex->iFrame = p->iFrame;
    for ( i = p->nRegs; i < p->nBits; i++ )
        if ( Abc_InfoHasBit(p->pData, i) )
        {
            iNew = p->nRegs + p->nPis * ((i - p->nRegs) / p->nPis) + Vec_IntEntry( vMapOld2New, (i - p->nRegs) % p->nPis );
            Abc_InfoSetBit( pCex->pData, iNew );
        }
    return pCex;
}